

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldConvertors.h
# Opt level: O0

UtcTimeOnly * FIX::UtcTimeOnlyConvertor::convert(UtcTimeOnly *__return_storage_ptr__,string *value)

{
  char cVar1;
  int hour_00;
  int minute;
  int second;
  ulong uVar2;
  FieldConvertError *pFVar3;
  char *pcVar4;
  int local_4c;
  char ch;
  int fraction;
  int sec;
  int min;
  int hour;
  int c;
  size_t i;
  size_t len;
  string *value_local;
  
  uVar2 = std::__cxx11::string::size();
  if ((uVar2 < 8) || (0x12 < uVar2)) {
    pFVar3 = (FieldConvertError *)__cxa_allocate_exception(0x50);
    FieldConvertError::FieldConvertError(pFVar3,value);
    __cxa_throw(pFVar3,&FieldConvertError::typeinfo,FieldConvertError::~FieldConvertError);
  }
  for (min = 0; min < 2; min = min + 1) {
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)value);
    if (9 < (int)*pcVar4 - 0x30U) {
      pFVar3 = (FieldConvertError *)__cxa_allocate_exception(0x50);
      FieldConvertError::FieldConvertError(pFVar3,value);
      __cxa_throw(pFVar3,&FieldConvertError::typeinfo,FieldConvertError::~FieldConvertError);
    }
  }
  pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)value);
  if (*pcVar4 != ':') {
    pFVar3 = (FieldConvertError *)__cxa_allocate_exception(0x50);
    FieldConvertError::FieldConvertError(pFVar3,value);
    __cxa_throw(pFVar3,&FieldConvertError::typeinfo,FieldConvertError::~FieldConvertError);
  }
  for (min = 0; min < 2; min = min + 1) {
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)value);
    if (9 < (int)*pcVar4 - 0x30U) {
      pFVar3 = (FieldConvertError *)__cxa_allocate_exception(0x50);
      FieldConvertError::FieldConvertError(pFVar3,value);
      __cxa_throw(pFVar3,&FieldConvertError::typeinfo,FieldConvertError::~FieldConvertError);
    }
  }
  pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)value);
  if (*pcVar4 != ':') {
    pFVar3 = (FieldConvertError *)__cxa_allocate_exception(0x50);
    FieldConvertError::FieldConvertError(pFVar3,value);
    __cxa_throw(pFVar3,&FieldConvertError::typeinfo,FieldConvertError::~FieldConvertError);
  }
  for (min = 0; min < 2; min = min + 1) {
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)value);
    if (9 < (int)*pcVar4 - 0x30U) {
      pFVar3 = (FieldConvertError *)__cxa_allocate_exception(0x50);
      FieldConvertError::FieldConvertError(pFVar3,value);
      __cxa_throw(pFVar3,&FieldConvertError::typeinfo,FieldConvertError::~FieldConvertError);
    }
  }
  pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)value);
  cVar1 = *pcVar4;
  pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)value);
  hour_00 = (cVar1 + -0x30) * 10 + (int)*pcVar4 + -0x30;
  if (0x17 < hour_00) {
    pFVar3 = (FieldConvertError *)__cxa_allocate_exception(0x50);
    FieldConvertError::FieldConvertError(pFVar3,value);
    __cxa_throw(pFVar3,&FieldConvertError::typeinfo,FieldConvertError::~FieldConvertError);
  }
  pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)value);
  cVar1 = *pcVar4;
  pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)value);
  minute = (cVar1 + -0x30) * 10 + (int)*pcVar4 + -0x30;
  if (0x3b < minute) {
    pFVar3 = (FieldConvertError *)__cxa_allocate_exception(0x50);
    FieldConvertError::FieldConvertError(pFVar3,value);
    __cxa_throw(pFVar3,&FieldConvertError::typeinfo,FieldConvertError::~FieldConvertError);
  }
  pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)value);
  cVar1 = *pcVar4;
  pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)value);
  second = (cVar1 + -0x30) * 10 + (int)*pcVar4 + -0x30;
  if (0x3c < second) {
    pFVar3 = (FieldConvertError *)__cxa_allocate_exception(0x50);
    FieldConvertError::FieldConvertError(pFVar3,value);
    __cxa_throw(pFVar3,&FieldConvertError::typeinfo,FieldConvertError::~FieldConvertError);
  }
  if (uVar2 == 8) {
    UtcTimeOnly::UtcTimeOnly(__return_storage_ptr__,hour_00,minute,second,0);
  }
  else {
    _hour = 9;
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)value);
    if (*pcVar4 != '.') {
      pFVar3 = (FieldConvertError *)__cxa_allocate_exception(0x50);
      FieldConvertError::FieldConvertError(pFVar3,value);
      __cxa_throw(pFVar3,&FieldConvertError::typeinfo,FieldConvertError::~FieldConvertError);
    }
    local_4c = 0;
    for (; _hour < uVar2; _hour = _hour + 1) {
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)value);
      if (9 < (int)*pcVar4 - 0x30U) {
        pFVar3 = (FieldConvertError *)__cxa_allocate_exception(0x50);
        FieldConvertError::FieldConvertError(pFVar3,value);
        __cxa_throw(pFVar3,&FieldConvertError::typeinfo,FieldConvertError::~FieldConvertError);
      }
      local_4c = local_4c * 10 + (int)*pcVar4 + -0x30;
    }
    UtcTimeOnly::UtcTimeOnly(__return_storage_ptr__,hour_00,minute,second,local_4c,(int)uVar2 + -9);
  }
  return __return_storage_ptr__;
}

Assistant:

static UtcTimeOnly convert( const std::string& value)
  EXCEPT ( FieldConvertError )
  {
    size_t len = value.size();
    if (len < 8 || len > 18) throw FieldConvertError(value);

    size_t i = 0;
    int c = 0;
    for( c = 0; c < 2; ++c )
      if( !IS_DIGIT(value[i++]) ) throw FieldConvertError(value);
    if( value[i++] != ':' ) throw FieldConvertError(value);
    for( c = 0; c < 2; ++c )
      if( !IS_DIGIT(value[i++]) ) throw FieldConvertError(value);
    if( value[i++] != ':' ) throw FieldConvertError(value);
    for( c = 0; c < 2; ++c )
      if( !IS_DIGIT(value[i++]) ) throw FieldConvertError(value);

    int hour, min, sec;

    i = 0;

    hour = value[i++] - '0';
    hour = 10 * hour + value[i++] - '0';
    // No check for >= 0 as no '-' are converted here
    if( 23 < hour ) throw FieldConvertError(value);

    ++i; // skip ':'

    min = value[i++] - '0';
    min = 10 * min + value[i++] - '0';
    // No check for >= 0 as no '-' are converted here
    if( 59 < min ) throw FieldConvertError(value);

    ++i; // skip ':'

    sec = value[i++] - '0';
    sec = 10 * sec + value[i++] - '0';

    // No check for >= 0 as no '-' are converted here
    if( 60 < sec ) throw FieldConvertError(value);

    if (len == 8)
      return UtcTimeOnly (hour, min, sec, 0);

    if( value[i++] != '.' ) throw FieldConvertError(value);

    int fraction = 0;
    for (; i < len; ++i)
    {
      char ch = value[i];
      if( !IS_DIGIT(ch)) throw FieldConvertError(value);
      fraction = (fraction * 10) + ch - '0';
    }

    return UtcTimeOnly (hour, min, sec, fraction, len - 8 - 1);
  }